

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

double llvm::scalbn(double __x,int __n)

{
  bool bVar1;
  fltSemantics *pfVar2;
  APFloat *in_RSI;
  undefined4 in_register_0000003c;
  APFloat *this;
  double __x_00;
  double extraout_XMM0_Qa;
  double __x_01;
  double extraout_XMM0_Qa_00;
  double dVar3;
  DoubleAPFloat local_70;
  DoubleAPFloat local_60;
  IEEEFloat local_50;
  IEEEFloat local_38;
  roundingMode RM_local;
  int Exp_local;
  APFloat *X_local;
  
  this = (APFloat *)CONCAT44(in_register_0000003c,__n);
  X_local = this;
  pfVar2 = APFloat::getSemantics(in_RSI);
  bVar1 = APFloat::usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    detail::IEEEFloat::IEEEFloat(&local_50,&(in_RSI->U).IEEE);
    detail::scalbn(__x_00,(int)&local_38);
    pfVar2 = APFloat::getSemantics(in_RSI);
    APFloat::APFloat(this,&local_38,pfVar2);
    detail::IEEEFloat::~IEEEFloat(&local_38);
    detail::IEEEFloat::~IEEEFloat(&local_50);
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    pfVar2 = APFloat::getSemantics(in_RSI);
    bVar1 = APFloat::usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x4ae);
    }
    detail::DoubleAPFloat::DoubleAPFloat(&local_70,(DoubleAPFloat *)&(in_RSI->U).IEEE);
    detail::scalbn(__x_01,(int)&local_60);
    pfVar2 = APFloat::getSemantics(in_RSI);
    APFloat::APFloat(this,&local_60,pfVar2);
    detail::DoubleAPFloat::~DoubleAPFloat(&local_60);
    detail::DoubleAPFloat::~DoubleAPFloat(&local_70);
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

inline APFloat scalbn(APFloat X, int Exp, APFloat::roundingMode RM) {
  if (APFloat::usesLayout<detail::IEEEFloat>(X.getSemantics()))
    return APFloat(scalbn(X.U.IEEE, Exp, RM), X.getSemantics());
  if (APFloat::usesLayout<detail::DoubleAPFloat>(X.getSemantics()))
    return APFloat(scalbn(X.U.Double, Exp, RM), X.getSemantics());
  llvm_unreachable("Unexpected semantics");
}